

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_divl(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  uint16_t uVar1;
  int iVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  bool bVar6;
  uint16_t ext;
  int sign;
  TCGv_i32 den;
  TCGv_i32 reg;
  TCGv_i32 num;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  bVar6 = (uVar1 & 0x800) == 0;
  if ((uVar1 & 0x400) == 0) {
    pTVar3 = gen_ea(env,s,insn,2,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                    (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar3 == tcg_ctx_00->NULL_QREG) {
      gen_addr_fault(s);
    }
    else {
      pTVar4 = tcg_const_i32_m68k(tcg_ctx_00,(int)(uint)uVar1 >> 0xc & 7);
      pTVar5 = tcg_const_i32_m68k(tcg_ctx_00,uVar1 & 7);
      if (bVar6) {
        gen_helper_divul(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar3);
      }
      else {
        gen_helper_divsl(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar3);
      }
      tcg_temp_free_i32(tcg_ctx_00,pTVar5);
      tcg_temp_free_i32(tcg_ctx_00,pTVar4);
      set_cc_op(s,CC_OP_FLAGS);
    }
  }
  else {
    iVar2 = m68k_feature(s->env,0x12);
    if (iVar2 == 0) {
      gen_exception(s,(s->base).pc_next,4);
    }
    else {
      pTVar3 = gen_ea(env,s,insn,2,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADU,
                      (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
      if (pTVar3 == tcg_ctx_00->NULL_QREG) {
        gen_addr_fault(s);
      }
      else {
        pTVar4 = tcg_const_i32_m68k(tcg_ctx_00,(int)(uint)uVar1 >> 0xc & 7);
        pTVar5 = tcg_const_i32_m68k(tcg_ctx_00,uVar1 & 7);
        if (bVar6) {
          gen_helper_divull(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar3);
        }
        else {
          gen_helper_divsll(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar4,pTVar5,pTVar3);
        }
        tcg_temp_free_i32(tcg_ctx_00,pTVar5);
        tcg_temp_free_i32(tcg_ctx_00,pTVar4);
        set_cc_op(s,CC_OP_FLAGS);
      }
    }
  }
  return;
}

Assistant:

DISAS_INSN(divl)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv num, reg, den;
    int sign;
    uint16_t ext;

    ext = read_im16(env, s);

    sign = (ext & 0x0800) != 0;

    if (ext & 0x400) {
        if (!m68k_feature(s->env, M68K_FEATURE_QUAD_MULDIV)) {
            gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
            return;
        }

        /* divX.l <EA>, Dr:Dq    64/32 -> 32r:32q */

        SRC_EA(env, den, OS_LONG, 0, NULL);
        num = tcg_const_i32(tcg_ctx, REG(ext, 12));
        reg = tcg_const_i32(tcg_ctx, REG(ext, 0));
        if (sign) {
            gen_helper_divsll(tcg_ctx, tcg_ctx->cpu_env, num, reg, den);
        } else {
            gen_helper_divull(tcg_ctx, tcg_ctx->cpu_env, num, reg, den);
        }
        tcg_temp_free(tcg_ctx, reg);
        tcg_temp_free(tcg_ctx, num);
        set_cc_op(s, CC_OP_FLAGS);
        return;
    }

    /* divX.l <EA>, Dq        32/32 -> 32q     */
    /* divXl.l <EA>, Dr:Dq    32/32 -> 32r:32q */

    SRC_EA(env, den, OS_LONG, 0, NULL);
    num = tcg_const_i32(tcg_ctx, REG(ext, 12));
    reg = tcg_const_i32(tcg_ctx, REG(ext, 0));
    if (sign) {
        gen_helper_divsl(tcg_ctx, tcg_ctx->cpu_env, num, reg, den);
    } else {
        gen_helper_divul(tcg_ctx, tcg_ctx->cpu_env, num, reg, den);
    }
    tcg_temp_free(tcg_ctx, reg);
    tcg_temp_free(tcg_ctx, num);

    set_cc_op(s, CC_OP_FLAGS);
}